

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lmi_helper.c
# Opt level: O2

uint64_t helper_pasubub_mips(uint64_t fs,uint64_t ft)

{
  uint8_t uVar1;
  long lVar2;
  uint8_t uVar3;
  LMIValue vs;
  LMIValue vt;
  
  vs.d = fs;
  vt.d = ft;
  for (lVar2 = 0; lVar2 != 8; lVar2 = lVar2 + 1) {
    uVar1 = (uint8_t)((uint)vs.ub[lVar2] - (uint)vt.ub[lVar2]);
    uVar3 = -uVar1;
    if (0 < (int)((uint)vs.ub[lVar2] - (uint)vt.ub[lVar2])) {
      uVar3 = uVar1;
    }
    vs.ub[lVar2] = uVar3;
  }
  return vs.d;
}

Assistant:

uint64_t helper_pasubub(uint64_t fs, uint64_t ft)
{
    LMIValue vs, vt;
    unsigned i;

    vs.d = fs;
    vt.d = ft;
    for (i = 0; i < 8; ++i) {
        int r = vs.ub[i] - vt.ub[i];
        vs.ub[i] = (r < 0 ? -r : r);
    }
    return vs.d;
}